

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8.h
# Opt level: O0

void ncnn::conv1x1s1_sgemm_transform_kernel_pack8_avx
               (Mat *kernel,Mat *weight_data_pack8,int num_input,int num_output)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  float *pfVar48;
  float *pfVar49;
  float *pfVar50;
  float *pfVar51;
  float *pfVar52;
  float *pfVar53;
  float *pfVar54;
  float *pfVar55;
  float *pfVar56;
  float *pfVar57;
  float *pfVar58;
  Mat *pMVar59;
  Mat *pMVar60;
  float *pfVar61;
  float *pfVar62;
  float *pfVar63;
  float *pfVar64;
  float *pfVar65;
  int in_ECX;
  int in_EDX;
  float *g00;
  float *k77;
  float *k76;
  float *k75;
  float *k74;
  float *k73;
  float *k72;
  float *k71;
  float *k70;
  float *k67;
  float *k66;
  float *k65;
  float *k64;
  float *k63;
  float *k62;
  float *k61;
  float *k60;
  float *k57;
  float *k56;
  float *k55;
  float *k54;
  float *k53;
  float *k52;
  float *k51;
  float *k50;
  float *k47;
  float *k46;
  float *k45;
  float *k44;
  float *k43;
  float *k42;
  float *k41;
  float *k40;
  float *k37;
  float *k36;
  float *k35;
  float *k34;
  float *k33;
  float *k32;
  float *k31;
  float *k30;
  float *k27;
  float *k26;
  float *k25;
  float *k24;
  float *k23;
  float *k22;
  float *k21;
  float *k20;
  float *k17;
  float *k16;
  float *k15;
  float *k14;
  float *k13;
  float *k12;
  float *k11;
  float *k10;
  float *k07;
  float *k06;
  float *k05;
  float *k04;
  float *k03;
  float *k02;
  float *k01;
  float *k00;
  int p;
  Mat g0;
  Mat k7;
  Mat k6;
  Mat k5;
  Mat k4;
  Mat k3;
  Mat k2;
  Mat k1;
  Mat k0;
  int q;
  Mat weight_data_r2;
  undefined8 in_stack_fffffffffffff8f0;
  int _elempack;
  size_t in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff900;
  int _c;
  undefined8 in_stack_fffffffffffff908;
  Mat *in_stack_fffffffffffff910;
  Mat *in_stack_fffffffffffff918;
  Allocator *in_stack_fffffffffffff920;
  Allocator *in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  undefined8 in_stack_fffffffffffff9a0;
  Mat *in_stack_fffffffffffff9a8;
  int local_2fc;
  Mat local_2f8;
  Mat local_2b0;
  Mat local_268;
  Mat local_220;
  Mat local_1d8;
  Mat local_190;
  Mat local_148;
  Mat local_100;
  Mat local_b8;
  int local_70;
  int local_18;
  int local_14;
  
  _c = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  _elempack = (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
  local_18 = in_ECX;
  local_14 = in_EDX;
  Mat::reshape(in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20),
               (int)in_stack_fffffffffffff9a0,(int)((ulong)in_stack_fffffffffffff998 >> 0x20),
               in_stack_fffffffffffff990);
  Mat::create(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20),
              (int)in_stack_fffffffffffff908,_c,in_stack_fffffffffffff8f8,_elempack,
              in_stack_fffffffffffff920);
  for (local_70 = 0; local_70 + 7 < local_18; local_70 = local_70 + 8) {
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
    for (local_2fc = 0; local_2fc + 7 < local_14; local_2fc = local_2fc + 8) {
      pfVar1 = Mat::row(&local_b8,local_2fc);
      pfVar2 = Mat::row(&local_b8,local_2fc + 1);
      pfVar3 = Mat::row(&local_b8,local_2fc + 2);
      pfVar4 = Mat::row(&local_b8,local_2fc + 3);
      pfVar5 = Mat::row(&local_b8,local_2fc + 4);
      pfVar6 = Mat::row(&local_b8,local_2fc + 5);
      pfVar7 = Mat::row(&local_b8,local_2fc + 6);
      pfVar8 = Mat::row(&local_b8,local_2fc + 7);
      pfVar9 = Mat::row(&local_100,local_2fc);
      pfVar10 = Mat::row(&local_100,local_2fc + 1);
      pfVar11 = Mat::row(&local_100,local_2fc + 2);
      pfVar12 = Mat::row(&local_100,local_2fc + 3);
      pfVar13 = Mat::row(&local_100,local_2fc + 4);
      pfVar14 = Mat::row(&local_100,local_2fc + 5);
      pfVar15 = Mat::row(&local_100,local_2fc + 6);
      pfVar16 = Mat::row(&local_100,local_2fc + 7);
      pfVar17 = Mat::row(&local_148,local_2fc);
      pfVar18 = Mat::row(&local_148,local_2fc + 1);
      pfVar19 = Mat::row(&local_148,local_2fc + 2);
      pfVar20 = Mat::row(&local_148,local_2fc + 3);
      pfVar21 = Mat::row(&local_148,local_2fc + 4);
      pfVar22 = Mat::row(&local_148,local_2fc + 5);
      pfVar23 = Mat::row(&local_148,local_2fc + 6);
      pfVar24 = Mat::row(&local_148,local_2fc + 7);
      pfVar25 = Mat::row(&local_190,local_2fc);
      pfVar26 = Mat::row(&local_190,local_2fc + 1);
      pfVar27 = Mat::row(&local_190,local_2fc + 2);
      pfVar28 = Mat::row(&local_190,local_2fc + 3);
      pfVar29 = Mat::row(&local_190,local_2fc + 4);
      pfVar30 = Mat::row(&local_190,local_2fc + 5);
      pfVar31 = Mat::row(&local_190,local_2fc + 6);
      pfVar32 = Mat::row(&local_190,local_2fc + 7);
      pfVar33 = Mat::row(&local_1d8,local_2fc);
      pfVar34 = Mat::row(&local_1d8,local_2fc + 1);
      pfVar35 = Mat::row(&local_1d8,local_2fc + 2);
      pfVar36 = Mat::row(&local_1d8,local_2fc + 3);
      pfVar37 = Mat::row(&local_1d8,local_2fc + 4);
      pfVar38 = Mat::row(&local_1d8,local_2fc + 5);
      pfVar39 = Mat::row(&local_1d8,local_2fc + 6);
      pfVar40 = Mat::row(&local_1d8,local_2fc + 7);
      pfVar41 = Mat::row(&local_220,local_2fc);
      pfVar42 = Mat::row(&local_220,local_2fc + 1);
      pfVar43 = Mat::row(&local_220,local_2fc + 2);
      pfVar44 = Mat::row(&local_220,local_2fc + 3);
      pfVar45 = Mat::row(&local_220,local_2fc + 4);
      pfVar46 = Mat::row(&local_220,local_2fc + 5);
      pfVar47 = Mat::row(&local_220,local_2fc + 6);
      pfVar48 = Mat::row(&local_220,local_2fc + 7);
      pfVar49 = Mat::row(&local_268,local_2fc);
      pfVar50 = Mat::row(&local_268,local_2fc + 1);
      pfVar51 = Mat::row(&local_268,local_2fc + 2);
      pfVar52 = Mat::row(&local_268,local_2fc + 3);
      pfVar53 = Mat::row(&local_268,local_2fc + 4);
      pfVar54 = Mat::row(&local_268,local_2fc + 5);
      pfVar55 = Mat::row(&local_268,local_2fc + 6);
      pfVar56 = Mat::row(&local_268,local_2fc + 7);
      pfVar57 = Mat::row(&local_2b0,local_2fc);
      pfVar58 = Mat::row(&local_2b0,local_2fc + 1);
      pMVar59 = (Mat *)Mat::row(&local_2b0,local_2fc + 2);
      in_stack_fffffffffffff918 = pMVar59;
      pMVar60 = (Mat *)Mat::row(&local_2b0,local_2fc + 3);
      in_stack_fffffffffffff910 = pMVar60;
      pfVar61 = Mat::row(&local_2b0,local_2fc + 4);
      pfVar62 = Mat::row(&local_2b0,local_2fc + 5);
      pfVar63 = Mat::row(&local_2b0,local_2fc + 6);
      pfVar64 = Mat::row(&local_2b0,local_2fc + 7);
      pfVar65 = Mat::row(&local_2f8,local_2fc / 8);
      *pfVar65 = *pfVar1;
      pfVar65[1] = *pfVar9;
      pfVar65[2] = *pfVar17;
      pfVar65[3] = *pfVar25;
      pfVar65[4] = *pfVar33;
      pfVar65[5] = *pfVar41;
      pfVar65[6] = *pfVar49;
      pfVar65[7] = *pfVar57;
      pfVar65[8] = *pfVar2;
      pfVar65[9] = *pfVar10;
      pfVar65[10] = *pfVar18;
      pfVar65[0xb] = *pfVar26;
      pfVar65[0xc] = *pfVar34;
      pfVar65[0xd] = *pfVar42;
      pfVar65[0xe] = *pfVar50;
      pfVar65[0xf] = *pfVar58;
      pfVar65[0x10] = *pfVar3;
      pfVar65[0x11] = *pfVar11;
      pfVar65[0x12] = *pfVar19;
      pfVar65[0x13] = *pfVar27;
      pfVar65[0x14] = *pfVar35;
      pfVar65[0x15] = *pfVar43;
      pfVar65[0x16] = *pfVar51;
      pfVar65[0x17] = *(float *)&pMVar59->data;
      pfVar65[0x18] = *pfVar4;
      pfVar65[0x19] = *pfVar12;
      pfVar65[0x1a] = *pfVar20;
      pfVar65[0x1b] = *pfVar28;
      pfVar65[0x1c] = *pfVar36;
      pfVar65[0x1d] = *pfVar44;
      pfVar65[0x1e] = *pfVar52;
      pfVar65[0x1f] = *(float *)&pMVar60->data;
      pfVar65[0x20] = *pfVar5;
      pfVar65[0x21] = *pfVar13;
      pfVar65[0x22] = *pfVar21;
      pfVar65[0x23] = *pfVar29;
      pfVar65[0x24] = *pfVar37;
      pfVar65[0x25] = *pfVar45;
      pfVar65[0x26] = *pfVar53;
      pfVar65[0x27] = *pfVar61;
      pfVar65[0x28] = *pfVar6;
      pfVar65[0x29] = *pfVar14;
      pfVar65[0x2a] = *pfVar22;
      pfVar65[0x2b] = *pfVar30;
      pfVar65[0x2c] = *pfVar38;
      pfVar65[0x2d] = *pfVar46;
      pfVar65[0x2e] = *pfVar54;
      pfVar65[0x2f] = *pfVar62;
      pfVar65[0x30] = *pfVar7;
      pfVar65[0x31] = *pfVar15;
      pfVar65[0x32] = *pfVar23;
      pfVar65[0x33] = *pfVar31;
      pfVar65[0x34] = *pfVar39;
      pfVar65[0x35] = *pfVar47;
      pfVar65[0x36] = *pfVar55;
      pfVar65[0x37] = *pfVar63;
      pfVar65[0x38] = *pfVar8;
      pfVar65[0x39] = *pfVar16;
      pfVar65[0x3a] = *pfVar24;
      pfVar65[0x3b] = *pfVar32;
      pfVar65[0x3c] = *pfVar40;
      pfVar65[0x3d] = *pfVar48;
      pfVar65[0x3e] = *pfVar56;
      pfVar65[0x3f] = *pfVar64;
    }
    Mat::~Mat((Mat *)0x1ed50f);
    Mat::~Mat((Mat *)0x1ed51c);
    Mat::~Mat((Mat *)0x1ed529);
    Mat::~Mat((Mat *)0x1ed536);
    Mat::~Mat((Mat *)0x1ed543);
    Mat::~Mat((Mat *)0x1ed550);
    Mat::~Mat((Mat *)0x1ed55d);
    Mat::~Mat((Mat *)0x1ed56a);
    Mat::~Mat((Mat *)0x1ed577);
  }
  Mat::~Mat((Mat *)0x1ed604);
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_pack8_avx(const Mat& kernel, Mat& weight_data_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(1, num_input, num_output);

    weight_data_pack8.create(1, num_input / 8, num_output / 8, (size_t)4 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = weight_data_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            float* g00 = g0.row(p / 8);
            g00[0] = k00[0];
            g00[1] = k10[0];
            g00[2] = k20[0];
            g00[3] = k30[0];
            g00[4] = k40[0];
            g00[5] = k50[0];
            g00[6] = k60[0];
            g00[7] = k70[0];
            g00 += 8;
            g00[0] = k01[0];
            g00[1] = k11[0];
            g00[2] = k21[0];
            g00[3] = k31[0];
            g00[4] = k41[0];
            g00[5] = k51[0];
            g00[6] = k61[0];
            g00[7] = k71[0];

            g00 += 8;
            g00[0] = k02[0];
            g00[1] = k12[0];
            g00[2] = k22[0];
            g00[3] = k32[0];
            g00[4] = k42[0];
            g00[5] = k52[0];
            g00[6] = k62[0];
            g00[7] = k72[0];

            g00 += 8;
            g00[0] = k03[0];
            g00[1] = k13[0];
            g00[2] = k23[0];
            g00[3] = k33[0];
            g00[4] = k43[0];
            g00[5] = k53[0];
            g00[6] = k63[0];
            g00[7] = k73[0];

            g00 += 8;
            g00[0] = k04[0];
            g00[1] = k14[0];
            g00[2] = k24[0];
            g00[3] = k34[0];
            g00[4] = k44[0];
            g00[5] = k54[0];
            g00[6] = k64[0];
            g00[7] = k74[0];

            g00 += 8;
            g00[0] = k05[0];
            g00[1] = k15[0];
            g00[2] = k25[0];
            g00[3] = k35[0];
            g00[4] = k45[0];
            g00[5] = k55[0];
            g00[6] = k65[0];
            g00[7] = k75[0];

            g00 += 8;
            g00[0] = k06[0];
            g00[1] = k16[0];
            g00[2] = k26[0];
            g00[3] = k36[0];
            g00[4] = k46[0];
            g00[5] = k56[0];
            g00[6] = k66[0];
            g00[7] = k76[0];

            g00 += 8;
            g00[0] = k07[0];
            g00[1] = k17[0];
            g00[2] = k27[0];
            g00[3] = k37[0];
            g00[4] = k47[0];
            g00[5] = k57[0];
            g00[6] = k67[0];
            g00[7] = k77[0];

            g00 += 8;
        }
    }
}